

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O0

errno_t wcsncpy_s(WCHAR *_Dst,size_t _SizeInWords,WCHAR *_Src,size_t _Count)

{
  short sVar1;
  undefined2 *puVar2;
  bool bVar3;
  size_t local_40;
  size_t available;
  WCHAR *p;
  size_t _Count_local;
  WCHAR *_Src_local;
  size_t _SizeInWords_local;
  WCHAR *_Dst_local;
  
  if (((_Count == 0) && (_Dst == (WCHAR *)0x0)) && (_SizeInWords == 0)) {
    _Dst_local._4_4_ = 0;
  }
  else if ((_Dst == (WCHAR *)0x0) || (_SizeInWords == 0)) {
    _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
    _Dst_local._4_4_ = 0x16;
  }
  else if (_Count == 0) {
    *_Dst = L'\0';
    if (1 < _SizeInWords) {
      memset(_Dst + 1,0xfd,(_SizeInWords - 1) * 2);
    }
    _Dst_local._4_4_ = 0;
  }
  else if (_Src == (WCHAR *)0x0) {
    *_Dst = L'\0';
    if (1 < _SizeInWords) {
      memset(_Dst + 1,0xfd,(_SizeInWords - 1) * 2);
    }
    _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
    _Dst_local._4_4_ = 0x16;
  }
  else {
    local_40 = _SizeInWords;
    available = (size_t)_Dst;
    p = (WCHAR *)_Count;
    _Count_local = (size_t)_Src;
    if (_Count == 0xffffffffffffffff) {
      do {
        sVar1 = *(short *)_Count_local;
        *(short *)available = sVar1;
        bVar3 = false;
        if (sVar1 != 0) {
          local_40 = local_40 - 1;
          bVar3 = local_40 != 0;
        }
        available = available + 2;
        _Count_local = _Count_local + 2;
      } while (bVar3);
    }
    else {
      do {
        sVar1 = *(short *)_Count_local;
        puVar2 = (undefined2 *)(available + 2);
        *(short *)available = sVar1;
        bVar3 = false;
        if (sVar1 != 0) {
          local_40 = local_40 - 1;
          bVar3 = false;
          if (local_40 != 0) {
            p = (WCHAR *)((long)p + -1);
            bVar3 = p != (WCHAR *)0x0;
          }
        }
        available = (size_t)puVar2;
        _Count_local = _Count_local + 2;
      } while (bVar3);
      if (p == (WCHAR *)0x0) {
        *puVar2 = 0;
      }
    }
    if (local_40 == 0) {
      if (p == (WCHAR *)&DAT_ffffffffffffffff) {
        _Dst[_SizeInWords - 1] = L'\0';
        _Dst_local._4_4_ = 0x50;
      }
      else {
        *_Dst = L'\0';
        if (1 < _SizeInWords) {
          memset(_Dst + 1,0xfd,(_SizeInWords - 1) * 2);
        }
        _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
        _Dst_local._4_4_ = 0x22;
      }
    }
    else {
      if ((_SizeInWords - local_40) + 1 < _SizeInWords) {
        memset(_Dst + (_SizeInWords - local_40) + 1,0xfd,(local_40 - 1) * 2);
      }
      _Dst_local._4_4_ = 0;
    }
  }
  return _Dst_local._4_4_;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl wcsncpy_s(WCHAR *_Dst, size_t _SizeInWords, const WCHAR *_Src, size_t _Count)
{
    WCHAR *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInWords == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInWords);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInWords);

    p = _Dst;
    available = _SizeInWords;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInWords - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInWords);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInWords, _SizeInWords - available + 1);
    return 0;
}